

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

void __thiscall GlobalSimpleStringMemoryAccountant::start(GlobalSimpleStringMemoryAccountant *this)

{
  _func_int **pp_Var1;
  TestMemoryAllocator *accountant;
  AccountingTestMemoryAllocator *in_RDI;
  char *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  TestMemoryAllocator *origAllocator;
  
  if ((in_RDI->super_TestMemoryAllocator)._vptr_TestMemoryAllocator == (_func_int **)0x0) {
    pp_Var1 = (_func_int **)
              operator_new(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x175471);
    origAllocator = (TestMemoryAllocator *)(in_RDI->super_TestMemoryAllocator).name_;
    accountant = SimpleString::getStringAllocator();
    AccountingTestMemoryAllocator::AccountingTestMemoryAllocator
              (in_RDI,(MemoryAccountant *)accountant,origAllocator);
    (in_RDI->super_TestMemoryAllocator)._vptr_TestMemoryAllocator = pp_Var1;
    SimpleString::setStringAllocator
              ((TestMemoryAllocator *)(in_RDI->super_TestMemoryAllocator)._vptr_TestMemoryAllocator)
    ;
  }
  return;
}

Assistant:

void GlobalSimpleStringMemoryAccountant::start()
{
    if (allocator_ != NULLPTR)
      return;

    allocator_ = new AccountingTestMemoryAllocator(*accountant_, SimpleString::getStringAllocator());

    SimpleString::setStringAllocator(allocator_);
}